

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entity.h
# Opt level: O1

void __thiscall
entityx::ComponentHelper<Test>::copy_component_to
          (ComponentHelper<Test> *this,Entity source,Entity target)

{
  ulong *puVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  Family FVar5;
  Pool<Test,_8192UL> *pPVar6;
  EntityManager *this_00;
  EntityManager *pEVar7;
  EntityManager *pEVar8;
  ulong uVar9;
  Id IVar10;
  EntityManager *pEVar11;
  bool bVar12;
  ComponentHandle<Test,_entityx::EntityManager> component;
  Entity local_50;
  ComponentHandle<Test,_entityx::EntityManager> local_40;
  
  IVar10 = target.id_.id_;
  this_00 = target.manager_;
  pEVar8 = source.manager_;
  FVar5 = EntityManager::component_family<____C_A_T_C_H____T_E_S_T____56()::Test>();
  pEVar7 = (EntityManager *)0x0;
  pEVar11 = (EntityManager *)0x0;
  if (FVar5 < (ulong)(*(long *)(pEVar8 + 0x20) - *(long *)(pEVar8 + 0x18) >> 3)) {
    if (*(long *)(*(long *)(pEVar8 + 0x18) + FVar5 * 8) == 0) {
      bVar12 = true;
    }
    else {
      bVar12 = (*(ulong *)(*(long *)(pEVar8 + 0x48) + (source.id_.id_.id_ & 0xffffffff) * 8) >>
                (FVar5 & 0x3f) & 1) == 0;
    }
    pEVar7 = pEVar8;
    if (bVar12) {
      pEVar7 = (EntityManager *)0x0;
    }
    pEVar11 = (EntityManager *)(source.id_.id_.id_ & 0xffffffff);
    if (bVar12) {
      pEVar11 = (EntityManager *)0x0;
    }
  }
  FVar5 = EntityManager::component_family<____C_A_T_C_H____T_E_S_T____56()::Test>();
  lVar2 = *(long *)(*(long *)(pEVar7 + 0x18) + FVar5 * 8);
  uVar3 = *(ulong *)(lVar2 + 0x28);
  lVar4 = *(long *)(*(long *)(lVar2 + 8) + ((ulong)pEVar11 / uVar3) * 8);
  lVar2 = *(long *)(lVar2 + 0x20);
  FVar5 = EntityManager::component_family<____C_A_T_C_H____T_E_S_T____56()::Test>();
  pPVar6 = EntityManager::accomodate_component<____C_A_T_C_H____T_E_S_T____56()::Test>(this_00);
  uVar9 = IVar10.id_ & 0xffffffff;
  *(undefined8 *)
   (*(long *)(*(long *)&pPVar6->field_0x8 + (uVar9 / *(ulong *)&pPVar6->field_0x28) * 8) +
   (uVar9 % *(ulong *)&pPVar6->field_0x28) * *(long *)&pPVar6->field_0x20) =
       *(undefined8 *)(lVar4 + ((ulong)pEVar11 % uVar3) * lVar2);
  if (0x3f < FVar5) {
    std::__throw_out_of_range_fmt
              ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",FVar5,0x40);
  }
  puVar1 = (ulong *)(*(long *)(this_00 + 0x48) + uVar9 * 8);
  *puVar1 = *puVar1 | 1L << ((byte)FVar5 & 0x3f);
  local_50.manager_ = this_00;
  local_50.id_.id_ = IVar10.id_;
  local_40.manager_ = this_00;
  local_40.id_.id_ = IVar10.id_;
  EventManager::
  emit<entityx::ComponentAddedEvent<____C_A_T_C_H____T_E_S_T____56()::Test>,entityx::Entity,entityx::ComponentHandle<____C_A_T_C_H____T_E_S_T____56()::Test,entityx::EntityManager>&>
            (*(EventManager **)(this_00 + 0x10),&local_50,&local_40);
  return;
}

Assistant:

void copy_component_to(Entity source, Entity target) override {
    target.assign_from_copy<C>(*(source.component<C>().get()));
  }